

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
          *handler)

{
  iterator *piVar1;
  char cVar2;
  internal iVar3;
  size_t sVar4;
  internal *piVar5;
  char *pcVar6;
  internal *piVar7;
  long lVar8;
  internal *piVar9;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *this_00;
  char *pcVar10;
  char *begin;
  internal *end;
  size_t sVar11;
  unsigned_long __n2;
  size_t sVar12;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
             *)format_str.size_;
  if (format_str.data_ == (char *)0x0) {
    return;
  }
  end = (internal *)(format_str.data_ + (long)this);
  piVar9 = (internal *)
           &(this_00->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .out_.blackhole_;
  do {
    piVar5 = this;
    if (*this != (internal)0x7b) {
      sVar12 = (long)end - (long)this;
      piVar5 = (internal *)memchr(this,0x7b,sVar12);
      if (piVar5 == (internal *)0x0) {
        pcVar6 = (char *)memchr(this,0x7d,sVar12);
        sVar11 = (this_00->context).
                 super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                 .out_.count_;
        while( true ) {
          if (pcVar6 == (char *)0x0) {
            sVar4 = 0;
            if (0 < (long)sVar12) {
              piVar9 = end + -1;
              sVar4 = sVar12;
            }
            iVar3 = *piVar9;
            (this_00->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .out_.count_ = sVar4 + sVar11;
            (this_00->context).
            super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            .out_.blackhole_ = (char)iVar3;
            return;
          }
          piVar5 = (internal *)(pcVar6 + 1);
          if ((piVar5 == end) || (*piVar5 != (internal)0x7d)) break;
          lVar8 = (long)piVar5 - (long)this;
          pcVar10 = pcVar6;
          if (lVar8 < 1) {
            lVar8 = 0;
            pcVar10 = (char *)piVar9;
          }
          sVar11 = sVar11 + lVar8;
          cVar2 = *pcVar10;
          (this_00->context).
          super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
          .out_.count_ = sVar11;
          (this_00->context).
          super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
          .out_.blackhole_ = cVar2;
          this = (internal *)(pcVar6 + 2);
          sVar12 = (long)end - (long)this;
          pcVar6 = (char *)memchr(this,0x7d,sVar12);
        }
        pcVar6 = "unmatched \'}\' in format string";
LAB_001e91c6:
        error_handler::on_error((error_handler *)this_00,pcVar6);
        return;
      }
    }
    if (this != piVar5) {
      sVar12 = (long)piVar5 - (long)this;
      pcVar6 = (char *)memchr(this,0x7d,sVar12);
      sVar11 = (this_00->context).
               super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
               .out_.count_;
      while (pcVar6 != (char *)0x0) {
        piVar7 = (internal *)(pcVar6 + 1);
        if ((piVar7 == piVar5) || (*piVar7 != (internal)0x7d)) {
          error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
          goto LAB_001e9061;
        }
        lVar8 = (long)piVar7 - (long)this;
        pcVar10 = pcVar6;
        if (lVar8 < 1) {
          lVar8 = 0;
          pcVar10 = (char *)piVar9;
        }
        sVar11 = sVar11 + lVar8;
        cVar2 = *pcVar10;
        (this_00->context).
        super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
        .out_.count_ = sVar11;
        (this_00->context).
        super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
        .out_.blackhole_ = cVar2;
        this = (internal *)(pcVar6 + 2);
        sVar12 = (long)piVar5 - (long)this;
        pcVar6 = (char *)memchr(this,0x7d,sVar12);
      }
      piVar7 = piVar5 + -1;
      if ((long)sVar12 < 1) {
        sVar12 = 0;
        piVar7 = piVar9;
      }
      iVar3 = *piVar7;
      (this_00->context).
      super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
      .out_.count_ = sVar12 + sVar11;
      (this_00->context).
      super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
      .out_.blackhole_ = (char)iVar3;
    }
LAB_001e9061:
    piVar7 = piVar5 + 1;
    if (piVar7 == end) {
      pcVar6 = "invalid format string";
      goto LAB_001e91c6;
    }
    if (*piVar7 == (internal)0x7b) {
      iVar3 = piVar5[1];
      piVar1 = &(this_00->context).
                super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                .out_;
      piVar1->count_ = piVar1->count_ + 1;
      (this_00->context).
      super_context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
      .out_.blackhole_ = (char)iVar3;
    }
    else {
      if (*piVar7 != (internal)0x7d) {
        local_58.long_long_value = (longlong)this_00;
        piVar7 = (internal *)
                 parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&,char>>
                           ((char *)piVar7,(char *)end,
                            (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_&,_char>
                             *)&local_58.string);
        if (piVar7 != end) {
          if (*piVar7 == (internal)0x3a) {
            piVar7 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                     ::on_format_specs(this_00,(char *)(piVar7 + 1),(char *)end);
            if ((piVar7 != end) && (*piVar7 == (internal)0x7d)) goto LAB_001e9114;
            pcVar6 = "unknown format specifier";
            goto LAB_001e91c6;
          }
          if (*piVar7 == (internal)0x7d) goto LAB_001e90e1;
        }
        pcVar6 = "missing \'}\' in format string";
        goto LAB_001e91c6;
      }
      basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>::next_arg
                ((format_arg *)&local_58.string,&this_00->context);
      (this_00->arg).type_ = local_48;
      (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
      (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001e90e1:
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
      ::on_replacement_field(this_00,(char *)piVar7);
    }
LAB_001e9114:
    this = piVar7 + 1;
    if (this == end) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}